

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<char>::resizeRealloc<slang::SmallVectorBase<char>::DefaultInitTag>
          (SmallVectorBase<char> *this,size_type newSize,DefaultInitTag *val)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  __uninitialized_default_construct_n_fn *this_00;
  char *in_RSI;
  EVP_PKEY_CTX *ctx;
  SmallVectorBase<char> *in_RDI;
  pointer newData;
  size_type newCap;
  char *in_stack_ffffffffffffffb8;
  char *__last;
  SmallVectorBase<char> *in_stack_ffffffffffffffd8;
  
  __last = in_RSI;
  pcVar1 = (char *)max_size((SmallVectorBase<char> *)0xebaf33);
  if (pcVar1 < __last) {
    detail::throwLengthError();
  }
  sVar2 = calculateGrowth(in_stack_ffffffffffffffd8,(size_type)in_RDI);
  pcVar3 = (pointer)operator_new(0xebaf67);
  this_00 = (__uninitialized_default_construct_n_fn *)begin(in_RDI);
  end(in_RDI);
  std::uninitialized_move<char*,char*>((char *)in_RDI,__last,(char *)this_00);
  ctx = (EVP_PKEY_CTX *)(pcVar3 + in_RDI->len);
  std::ranges::__uninitialized_default_construct_n_fn::operator()<char_*>
            (this_00,in_stack_ffffffffffffffb8,0xebafba);
  cleanup(in_RDI,ctx);
  in_RDI->len = (size_type)in_RSI;
  in_RDI->cap = sVar2;
  in_RDI->data_ = pcVar3;
  return;
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    SLANG_ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::ranges::uninitialized_fill_n(newData + len, ptrdiff_t(newSize - len), val);
    }
    else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
        std::ranges::uninitialized_default_construct_n(newData + len, ptrdiff_t(newSize - len));
    }
    else {
        std::ranges::uninitialized_value_construct_n(newData + len, ptrdiff_t(newSize - len));
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}